

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O2

void __thiscall
Assimp::LWSImporter::ReadEnvelope_Old
          (LWSImporter *this,const_iterator *it,const_iterator *end,NodeDesc *nodes,uint param_4)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  uint uVar3;
  uint uVar4;
  Logger *this_00;
  ulong uVar5;
  bool bVar6;
  float f;
  NodeDesc *local_88;
  list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *local_80;
  ulong local_78;
  char *c;
  Key key;
  
  p_Var1 = it->_M_node->_M_next;
  it->_M_node = p_Var1;
  local_88 = nodes;
  if (p_Var1 == end->_M_node) {
LAB_004209a3:
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"LWS: Encountered unexpected end of file while parsing object motion");
  }
  else {
    uVar3 = strtoul10((char *)p_Var1[1]._M_next,(char **)0x0);
    local_80 = &local_88->channels;
    uVar5 = 0;
    while (uVar4 = (uint)uVar5, uVar4 != uVar3) {
      key.time = 3.39519326554444e-313;
      key.value = 1.4013e-45;
      key.inter = IT_LINE;
      key.params[4] = 0.0;
      key._36_4_ = 0;
      key.params[0] = 0.0;
      key.params[1] = 0.0;
      key.params[2] = 0.0;
      key.params[3] = 0.0;
      std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::push_back
                (local_80,(value_type *)&key);
      std::_Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::~_Vector_base
                ((_Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)key.params);
      p_Var1 = (local_88->channels).
               super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
               _M_impl._M_node.super__List_node_base._M_prev;
      *(uint *)&p_Var1[1]._M_next = uVar4;
      local_78 = (ulong)(uVar4 + 1);
      *(uint *)((long)&p_Var1[1]._M_next + 4) = uVar4 + 1;
      p_Var2 = it->_M_node->_M_next;
      it->_M_node = p_Var2;
      if (p_Var2 == end->_M_node) goto LAB_004209a3;
      uVar4 = strtoul10((char *)p_Var2[1]._M_next,(char **)0x0);
      while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, uVar5 = local_78, bVar6) {
        p_Var2 = it->_M_node->_M_next;
        it->_M_node = p_Var2;
        if (p_Var2 == end->_M_node) goto LAB_004209a3;
        key.time = 0.0;
        key.value = 0.0;
        key.inter = IT_LINE;
        key.params[0] = 0.0;
        key.params[1] = 0.0;
        key.params[2] = 0.0;
        key.params[3] = 0.0;
        key._32_8_ = key._32_8_ & 0xffffffff00000000;
        c = fast_atoreal_move<float>((char *)p_Var2[1]._M_next,&key.value,true);
        SkipSpaces<char>(&c);
        fast_atoreal_move<float>((char *)it->_M_node[1]._M_next,&f,true);
        key.time = (double)f;
        std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::push_back
                  ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)(p_Var1 + 2),&key)
        ;
      }
    }
  }
  return;
}

Assistant:

void LWSImporter::ReadEnvelope_Old(
    std::list< LWS::Element >::const_iterator& it,
    const std::list< LWS::Element >::const_iterator& end,
    LWS::NodeDesc& nodes,
    unsigned int /*version*/)
{
    unsigned int num,sub_num;
    if (++it == end)goto unexpected_end;

    num = strtoul10((*it).tokens[0].c_str());
    for (unsigned int i = 0; i < num; ++i) {

        nodes.channels.push_back(LWO::Envelope());
        LWO::Envelope& envl = nodes.channels.back();

        envl.index = i;
        envl.type  = (LWO::EnvelopeType)(i+1);

        if (++it == end)goto unexpected_end;
        sub_num = strtoul10((*it).tokens[0].c_str());

        for (unsigned int n = 0; n < sub_num;++n) {

            if (++it == end)goto unexpected_end;

            // parse value and time, skip the rest for the moment.
            LWO::Key key;
            const char* c = fast_atoreal_move<float>((*it).tokens[0].c_str(),key.value);
            SkipSpaces(&c);
            float f;
            fast_atoreal_move<float>((*it).tokens[0].c_str(),f);
            key.time = f;

            envl.keys.push_back(key);
        }
    }
    return;

unexpected_end:
    ASSIMP_LOG_ERROR("LWS: Encountered unexpected end of file while parsing object motion");
}